

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O3

void unlink_objsymbol(Symbol *delsym)

{
  ObjectUnit *pOVar1;
  Symbol **ppSVar2;
  Symbol *pSVar3;
  unsigned_long uVar4;
  Symbol **ppSVar5;
  char *pcVar6;
  char *errtxt;
  
  if ((delsym->relsect == (Section *)0x0) ||
     (pOVar1 = delsym->relsect->obj, pOVar1 == (ObjectUnit *)0x0)) {
    pcVar6 = delsym->name;
    errtxt = "%s %s has no object or section";
  }
  else {
    ppSVar2 = pOVar1->objsyms;
    uVar4 = elf_hash(delsym->name);
    ppSVar2 = ppSVar2 + ((uint)uVar4 & 0x1f);
    do {
      ppSVar5 = ppSVar2;
      pSVar3 = *ppSVar5;
      if (pSVar3 == (Symbol *)0x0) break;
      ppSVar2 = &pSVar3->obj_chain;
    } while (pSVar3 != delsym);
    if (pSVar3 != (Symbol *)0x0) {
      *ppSVar5 = delsym->obj_chain;
      delsym->obj_chain = (Symbol *)0x0;
      return;
    }
    pcVar6 = delsym->name;
    errtxt = "%s %s could not be found in any object";
  }
  ierror(errtxt,"unlink_objsymbol():",pcVar6);
  return;
}

Assistant:

static void unlink_objsymbol(struct Symbol *delsym)
/* unlink a symbol from an object unit's hash chain */
{
  const char *fn = "unlink_objsymbol():";
  struct ObjectUnit *ou = delsym->relsect ? delsym->relsect->obj : NULL;

  if (ou) {
    struct Symbol **chain = &ou->objsyms[elf_hash(delsym->name)%OBJSYMHTABSIZE];
    struct Symbol *sym;

    while (sym = *chain) {
      if (sym == delsym)
        break;
      chain = &sym->obj_chain;
    }
    if (sym) {
      /* unlink the symbol node from the chain */
      *chain = delsym->obj_chain;
      delsym->obj_chain = NULL;
    }
    else
      ierror("%s %s could not be found in any object",fn,delsym->name);
  }
  else
    ierror("%s %s has no object or section",fn,delsym->name);
}